

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O3

Tree flute_mr(int d,int *xs,int *ys,int *s,int acc,int rounds,int **dist,int *threshold_x,
             int *threshold_y,int *threshold,int *best_round,int *min_node1,int *min_node2,int **nb)

{
  size_t __n;
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  Branch *__ptr;
  dl_el_s *pdVar4;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  dl_t paVar11;
  long lVar12;
  ulong uVar13;
  int *piVar14;
  Tree *__ptr_00;
  dl_el *pdVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  char cVar23;
  uint uVar24;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  undefined1 auVar32 [16];
  Tree TVar33;
  Tree TVar34;
  Tree t2;
  bool bStack_3ec55;
  int iStack_3ec54;
  ulong uStack_3ec40;
  Branch *pBStack_3ec38;
  uint uStack_3ebfc;
  int iStack_3ebd8;
  int iStack_3ebd4;
  int iStack_3ebd0;
  int iStack_3ebcc;
  int *order [110];
  int tree_id [500];
  int idx [500];
  int tree_size [500];
  int offset [500];
  int edges [1000];
  int subroot [500];
  int suproot [500];
  int y [1000];
  int x [1000];
  int isSuperRoot [500];
  int xmap [1000];
  int si [500];
  int new_s [1000];
  int order_base [55000];
  uint uVar25;
  
  uVar20 = (ulong)(uint)d;
  if (-1 < d) {
    lVar26 = 0;
    do {
      paVar11 = dl_alloc();
      *(dl_t *)((long)ht + lVar26) = paVar11;
      lVar26 = lVar26 + 8;
    } while (uVar20 * 8 + 8 != lVar26);
  }
  lVar26 = (long)d;
  piVar14 = order_base;
  lVar19 = 0;
  do {
    order[lVar19] = piVar14;
    lVar19 = lVar19 + 1;
    piVar14 = piVar14 + lVar26;
  } while (lVar19 != 0x6e);
  if (rounds < 0) {
    uStack_3ec40 = 0x7fffffff;
    pBStack_3ec38 = (Branch *)0x0;
  }
  else {
    __n = uVar20 * 4;
    lVar12 = (long)(d * 2 + -2);
    lVar19 = uVar20 - 1;
    auVar27._8_4_ = (int)lVar19;
    auVar27._0_8_ = lVar19;
    auVar27._12_4_ = (int)((ulong)lVar19 >> 0x20);
    uStack_3ec40 = 0x7fffffff;
    auVar27 = auVar27 ^ _DAT_0016c6c0;
    pBStack_3ec38 = (Branch *)0x0;
    do {
      if (d < 1) {
        if (rounds != FIRST_ROUND) goto LAB_001276d3;
        build_rmst(lVar26,x,y,edges,tree_id);
LAB_001276b6:
        if (rounds != 0) {
          iStack_3ec54 = 0;
        }
LAB_00127a57:
        subroot[0] = edges[0];
        suproot[0] = edges[0];
        uVar22 = 1;
        cVar23 = '\0';
LAB_00127b32:
        offset[1] = 0;
        bVar7 = false;
        memset(idx,0,(ulong)uVar22 * 4 + 4);
      }
      else {
        memset(isSuperRoot,0,__n);
        memcpy(y,ys,__n);
        uVar13 = 0;
        do {
          x[uVar13] = xs[s[uVar13]];
          uVar13 = uVar13 + 1;
        } while (uVar20 != uVar13);
        if (rounds == FIRST_ROUND) {
          build_rmst(lVar26,x,y,edges,tree_id);
          if (d < 1) goto LAB_001276b6;
          uVar13 = 0;
          do {
            dist[uVar13][uVar13] = 0;
            uVar13 = uVar13 + 1;
          } while (uVar20 != uVar13);
        }
        else {
LAB_001276d3:
          mst_from_heap(d,dist,*min_node1,*min_node2,nb,edges,tree_id);
        }
        auVar32 = _DAT_0016c6c0;
        if (rounds != 0) {
          iStack_3ec54 = 0;
        }
        iStack_3ebd8 = auVar27._0_4_;
        iStack_3ebd4 = auVar27._4_4_;
        iStack_3ebd0 = auVar27._8_4_;
        iStack_3ebcc = auVar27._12_4_;
        if (0 < d && rounds != 0) {
          uVar13 = 0;
          do {
            nb[uVar13][1] = 2;
            uVar13 = uVar13 + 1;
          } while (uVar20 != uVar13);
          iStack_3ec54 = 0;
        }
        if (1 < d) {
          lVar19 = 0;
          do {
            if (rounds != 0) {
              iVar31 = edges[lVar19];
              iVar1 = edges[lVar19 + 1];
              piVar14 = nb[iVar31];
              iVar16 = piVar14[1];
              if (*piVar14 == iVar16) {
                iVar16 = *piVar14 * 2 + 2;
                piVar14 = (int *)realloc(piVar14,(long)iVar16 * 4);
                nb[iVar31] = piVar14;
                *piVar14 = iVar16;
                iVar16 = piVar14[1];
              }
              piVar14[1] = iVar16 + 1;
              piVar14[iVar16] = iVar1;
              piVar14 = nb[iVar1];
              iVar16 = piVar14[1];
              if (*piVar14 == iVar16) {
                iVar16 = *piVar14 * 2 + 2;
                piVar14 = (int *)realloc(piVar14,(long)iVar16 * 4);
                nb[iVar1] = piVar14;
                *piVar14 = iVar16;
                iVar16 = piVar14[1];
              }
              auVar32 = _DAT_0016c6c0;
              piVar14[1] = iVar16 + 1;
              piVar14[iVar16] = iVar31;
              iVar8 = x[iVar31] - x[iVar1];
              iVar16 = -iVar8;
              if (0 < iVar8) {
                iVar16 = iVar8;
              }
              iVar9 = y[iVar31] - y[iVar1];
              iVar8 = -iVar9;
              if (0 < iVar9) {
                iVar8 = iVar9;
              }
              iVar8 = iVar8 + iVar16;
              dist[iVar1][iVar31] = iVar8;
              dist[iVar31][iVar1] = iVar8;
              if (iStack_3ec54 <= iVar8) {
                iStack_3ec54 = iVar8;
              }
            }
            lVar19 = lVar19 + 2;
          } while (lVar19 < lVar12);
        }
        if (d < 1) goto LAB_00127a57;
        lVar19 = 0;
        auVar28 = _DAT_0016c6b0;
        auVar29 = _DAT_0016dc60;
        do {
          auVar30 = auVar28 ^ auVar32;
          if ((bool)(~(auVar30._4_4_ == iStack_3ebd4 && iStack_3ebd8 < auVar30._0_4_ ||
                      iStack_3ebd4 < auVar30._4_4_) & 1)) {
            *(undefined4 *)((long)tree_size + lVar19) = 1;
          }
          if ((auVar30._12_4_ != iStack_3ebcc || auVar30._8_4_ <= iStack_3ebd0) &&
              auVar30._12_4_ <= iStack_3ebcc) {
            *(undefined4 *)((long)tree_size + lVar19 + 4) = 1;
          }
          iVar31 = SUB164(auVar29 ^ auVar32,4);
          if (iVar31 <= iStack_3ebd4 &&
              (iVar31 != iStack_3ebd4 || SUB164(auVar29 ^ auVar32,0) <= iStack_3ebd8)) {
            *(undefined4 *)((long)tree_size + lVar19 + 8) = 1;
            *(undefined4 *)((long)tree_size + lVar19 + 0xc) = 1;
          }
          lVar21 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 4;
          auVar28._8_8_ = lVar21 + 4;
          lVar21 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 4;
          auVar29._8_8_ = lVar21 + 4;
          lVar19 = lVar19 + 0x10;
        } while ((ulong)(d + 3U >> 2) << 4 != lVar19);
        subroot[0] = edges[0];
        suproot[0] = edges[0];
        if (d < 2) {
          uVar10 = 0;
          uVar22 = 1;
        }
        else {
          uVar22 = 1;
          lVar19 = (long)(d * 2 + -4) + 3;
          do {
            iVar31 = offset[lVar19 + 0x1f2];
            iVar1 = offset[lVar19 + 0x1f1];
            if ((double)acc * 1.3 + 8.0 <= (double)(tree_size[iVar31] + tree_size[iVar1])) {
              isSuperRoot[iVar1] = 1;
              suproot[(int)uVar22] = iVar1;
              subroot[(int)uVar22] = iVar31;
              uVar22 = uVar22 + 1;
            }
            else {
              tree_size[iVar1] = tree_size[iVar31] + tree_size[iVar1];
            }
            lVar19 = lVar19 + -2;
          } while (1 < lVar19);
          uVar10 = (uint)(1 < (int)uVar22);
          if ((int)uVar22 < 2) {
            uVar10 = 0;
          }
          else {
            uVar13 = 1;
            do {
              iVar31 = subroot[uVar13];
              uVar13 = uVar13 + 1;
              tree_id[iVar31] = (int)uVar13;
              tree_size[iVar31] = tree_size[iVar31] + 1;
            } while (uVar22 != uVar13);
          }
          if (1 < d) {
            lVar19 = 0;
            do {
              if (tree_id[edges[lVar19 + 1]] == 1) {
                tree_id[edges[lVar19 + 1]] = tree_id[edges[lVar19]];
              }
              lVar19 = lVar19 + 2;
            } while (lVar19 < lVar12);
          }
        }
        if (0 < d) {
          uVar13 = 0;
          do {
            si[s[uVar13]] = (int)uVar13;
            uVar13 = uVar13 + 1;
          } while (uVar20 != uVar13);
        }
        offset[1] = 0;
        uVar24 = 0;
        uVar25 = uVar24;
        if ((char)uVar10 != '\0') {
          lVar19 = 0;
          do {
            uVar24 = uVar24 + tree_size[subroot[lVar19]];
            offset[lVar19 + 2] = uVar24;
            lVar19 = lVar19 + 1;
            uVar25 = uVar10;
          } while ((ulong)uVar22 - 1 != lVar19);
        }
        cVar23 = (char)uVar25;
        if (-1 < (int)uVar22) goto LAB_00127b32;
        bVar7 = true;
      }
      bStack_3ec55 = rounds != 0;
      uVar13 = (ulong)uVar22;
      if (0 < d) {
        uVar17 = 0;
        do {
          iVar31 = si[uVar17];
          iVar1 = tree_id[iVar31];
          iVar16 = idx[iVar1];
          idx[iVar1] = iVar16 + 1;
          iVar8 = xs[uVar17];
          x[(long)offset[iVar1] + (long)iVar16] = iVar8;
          xmap[uVar17] = iVar16;
          if ((isSuperRoot[iVar31] != 0) && (1 < (int)uVar22)) {
            lVar19 = 0;
            do {
              if (suproot[lVar19 + 1] == iVar31) {
                iVar1 = idx[lVar19 + 2];
                idx[lVar19 + 2] = iVar1 + 1;
                x[(long)offset[lVar19 + 2] + (long)iVar1] = iVar8;
                xmap[d + 1 + (int)lVar19] = iVar1;
              }
              lVar19 = lVar19 + 1;
            } while (uVar13 - 1 != lVar19);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar20);
      }
      if (!bVar7) {
        memset(idx,0,uVar13 * 4 + 4);
      }
      if (0 < d) {
        uVar17 = 0;
        do {
          lVar19 = (long)tree_id[uVar17];
          iVar31 = idx[lVar19];
          idx[lVar19] = iVar31 + 1;
          lVar21 = (long)offset[lVar19] + (long)iVar31;
          y[lVar21] = ys[uVar17];
          new_s[lVar21] = xmap[s[uVar17]];
          order[lVar19 + -1][iVar31] = (int)uVar17;
          if ((isSuperRoot[uVar17] != 0) && (1 < (int)uVar22)) {
            uVar18 = 1;
            do {
              if (uVar17 == (uint)suproot[uVar18]) {
                iVar31 = idx[uVar18 + 1];
                idx[uVar18 + 1] = iVar31 + 1;
                lVar19 = (long)offset[uVar18 + 1] + (long)iVar31;
                y[lVar19] = ys[uVar17];
                new_s[lVar19] = xmap[d + (int)uVar18];
                order[uVar18][iVar31] = (int)uVar17;
              }
              uVar18 = uVar18 + 1;
            } while (uVar13 != uVar18);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar20);
      }
      __ptr_00 = (Tree *)malloc((long)(int)uVar22 << 4);
      if (0 < (int)uVar22) {
        lVar19 = 0;
        do {
          if (tree_size[*(int *)((long)subroot + lVar19)] < 2) {
            (&__ptr_00->deg)[lVar19] = 0;
          }
          else {
            iVar31 = *(int *)((long)offset + lVar19 + 4);
            TVar33 = flutes_c(tree_size[*(int *)((long)subroot + lVar19)],x + iVar31,y + iVar31,
                              new_s + iVar31,acc);
            *(long *)(&__ptr_00->deg + lVar19) = TVar33._0_8_;
            *(Branch **)((long)&__ptr_00->branch + lVar19 * 4) = TVar33.branch;
          }
          lVar19 = lVar19 + 4;
        } while (uVar13 * 4 - lVar19 != 0);
      }
      if (cVar23 != '\0') {
        uVar17 = 1;
        do {
          iVar31 = suproot[uVar17];
          lVar19 = (long)tree_id[iVar31];
          lVar21 = (long)tree_id[subroot[uVar17]];
          uVar2 = __ptr_00[lVar19 + -1].deg;
          uVar5 = __ptr_00[lVar19 + -1].length;
          TVar33.length = uVar5;
          TVar33.deg = uVar2;
          uVar3 = __ptr_00[lVar21 + -1].deg;
          uVar6 = __ptr_00[lVar21 + -1].length;
          t2.length = uVar6;
          t2.deg = uVar3;
          TVar33.branch = __ptr_00[lVar19 + -1].branch;
          t2.branch = __ptr_00[lVar21 + -1].branch;
          TVar33 = wmergetree(TVar33,t2,order[lVar19 + -1],order[lVar21 + -1],xs[s[iVar31]],
                              ys[iVar31],acc);
          __ptr_00[lVar21 + -1].deg = 0;
          __ptr_00[lVar19 + -1].deg = (int)TVar33._0_8_;
          __ptr_00[lVar19 + -1].length = (int)(TVar33._0_8_ >> 0x20);
          __ptr_00[lVar19 + -1].branch = TVar33.branch;
          uVar17 = uVar17 + 1;
        } while (uVar13 != uVar17);
      }
      uVar13._0_4_ = __ptr_00->deg;
      uVar13._4_4_ = __ptr_00->length;
      __ptr = __ptr_00->branch;
      TVar33 = *__ptr_00;
      free(__ptr_00);
      if ((int)uStack_3ec40 < (int)uVar13._4_4_) {
        if (EARLY_QUIT_CRITERIA <= *best_round - rounds) {
          if (__ptr != (Branch *)0x0) {
            free(__ptr);
          }
          break;
        }
      }
      else {
        if ((int)uStack_3ec40 != uVar13._4_4_) {
          if (pBStack_3ec38 != (Branch *)0x0) {
            free(pBStack_3ec38);
          }
          pBStack_3ec38 = __ptr;
          uStack_3ec40 = uVar13 >> 0x20;
          uStack_3ebfc = (undefined4)uVar13;
        }
        *best_round = rounds;
      }
      if (bStack_3ec55) {
        if (0 < d) {
          memcpy(y,ys,__n);
          uVar13 = 0;
          do {
            x[uVar13] = xs[s[uVar13]];
            uVar13 = uVar13 + 1;
          } while (uVar20 != uVar13);
        }
        *min_node1 = edges[0];
        *min_node2 = edges[1];
        update_dist2(TVar33,dist,iStack_3ec54,edges,min_node1,min_node2,nb);
      }
      if (pBStack_3ec38 != __ptr && __ptr != (Branch *)0x0) {
        free(__ptr);
      }
      bVar7 = 0 < rounds;
      rounds = rounds + -1;
    } while (bVar7);
  }
  if (-1 < d) {
    uVar20 = 0;
    do {
      paVar11 = ht[uVar20];
      pdVar15 = paVar11->first;
      if (paVar11->first != (dl_el *)0x0) {
        do {
          pdVar4 = pdVar15->next;
          free(pdVar15[1].next);
          pdVar15 = pdVar4;
        } while (pdVar4 != (dl_el_s *)0x0);
        paVar11 = ht[uVar20];
      }
      dl_clear(paVar11);
      free(ht[uVar20]);
      ht[uVar20] = (dl_t)0x0;
      uVar20 = uVar20 + 1;
    } while (uVar20 != d + 1);
  }
  TVar34._0_8_ = (ulong)uStack_3ebfc | uStack_3ec40 << 0x20;
  TVar34.branch = pBStack_3ec38;
  return TVar34;
}

Assistant:

Tree flute_mr(int d, DTYPE *xs, DTYPE *ys, int *s,
	      int acc, int rounds, DTYPE **dist,
	      DTYPE *threshold_x, DTYPE *threshold_y,
	      DTYPE *threshold, 
	      int *best_round,
	      int *min_node1, int *min_node2,
	      int **nb)
{
  int i, j, k, m, n, itr, node1, node2;
  DTYPE min_dist, longest;
  DTYPE dist1, dist2;
  Tree t, best_t, *subtree, ttmp;
  DTYPE min_x, max_x;

#if MR_FOR_SMALL_CASES_ONLY
  int num_subtree, subroot[MAXPART], suproot[MAXPART], isSuperRoot[D2M];
  int tree_id[D2M], tid, tree_size[D2M], edges[2*D2M];
  int idx[MAXPART], offset[MAXPART], *order[MAXT], order_base[MAXT*D2M];
  DTYPE x[D2M+MAXPART], y[D2M+MAXPART];
  int new_s[D2M+MAXPART], si[D2M], xmap[D2M+MAXPART];
#else
  int num_subtree, *subroot, *suproot, *isSuperRoot;
  int *tree_id, tid, *tree_size, *edges;
  int *idx, *offset, **order, *order_base;
  DTYPE *x, *y;
  int *new_s, *si, *xmap;

  subroot = (int*)malloc(sizeof(int)*MAXPART);
  suproot = (int*)malloc(sizeof(int)*MAXPART);
  idx = (int*)malloc(sizeof(int)*MAXPART);
  offset = (int*)malloc(sizeof(int)*MAXPART);
  order = (int**)malloc(sizeof(int*)*MAXT);

  isSuperRoot = (int*)malloc(sizeof(int)*d);
  tree_id = (int*)malloc(sizeof(int)*d);
  tree_size = (int*)malloc(sizeof(int)*d);
  edges = (int*)malloc(sizeof(int)*d*2);
  order_base = (int*)malloc(sizeof(int)*d*MAXT);
  new_s = (int*)malloc(sizeof(int)*(d+MAXPART));
  si = (int*)malloc(sizeof(int)*d);
  xmap = (int*)malloc(sizeof(int)*(d+MAXPART));
  x = (DTYPE*)malloc(sizeof(DTYPE)*(d+MAXPART));
  y = (DTYPE*)malloc(sizeof(DTYPE)*(d+MAXPART));
#endif

#if USE_HASHING
  if (new_ht) {
    for (i=0; i<=d; i++) {
      ht[i] = dl_alloc();
    }
  }
#endif

  best_t.branch = NULL;
  best_t.length = INFNTY;

  for (i=0; i<MAXT; i++) {
    //order[i] = &(order_base[i*D2(acc)]);
    order[i] = &(order_base[i*d]);
  }

  while (rounds>=0) {
    for (i=0; i<d; i++) {
      x[i] = xs[s[i]];
      y[i] = ys[i];
      isSuperRoot[i] = 0;
    }

    if (rounds==FIRST_ROUND) {
      build_rmst((long)d, x, y, edges, tree_id);
      for (i=0; i<d; i++) dist[i][i]=0;
    } else {
      mst_from_heap(d, dist, *min_node1, *min_node2, nb, edges, tree_id);
    }

    if (rounds!=0) {
      longest = 0;
      for (i=0; i<d; i++) {
	init_queue(nb[i]);
      }
    }

    for (i=0; i<2*d-2; ) {
      node1 = edges[i++];
      node2 = edges[i++];
      if (rounds!=0) {
	enqueue(&nb[node1], node2);
	enqueue(&nb[node2], node1);
	dist[node1][node2] = dist[node2][node1] =
	  ADIFF(x[node1], x[node2]) + ADIFF(y[node1], y[node2]);
	if (longest < dist[node1][node2]) {
	  longest = dist[node1][node2];
	}
      }
    }

    for (i=0; i<d; i++) {
      tree_size[i] = 1;  // the node itself
    }

    suproot[0] = subroot[0] = edges[0];
    num_subtree=1;

    for (i=2*d-3; i>=0; ) {
      node2 = edges[i--];
      node1 = edges[i--];
      j = tree_size[node1]+tree_size[node2];
      //Chris
      if (j >= TAU(acc)) {
	isSuperRoot[node1] = 1;
	suproot[num_subtree] = node1;
	subroot[num_subtree++] = node2;
      } else {
	tree_size[node1] = j;
      }
    }

    //assert(num_subtree<=MAXT);

    for (i=1; i<num_subtree; i++) {
      tree_id[subroot[i]] = i+1;
      tree_size[subroot[i]] += 1;  // to account for the link to parent tree
    }

    for (i=0; i<2*d-2; ) {
      node1 = edges[i++];
      node2 = edges[i++];
      if (tree_id[node2]==1) { // non-root node
	tree_id[node2] = tree_id[node1];
      }
    }

    // Find inverse si[] of s[]
    for (i=0; i<d; i++)
      si[s[i]] = i;

    offset[1] = 0;
    for (i=1; i<num_subtree; i++) {
      offset[i+1] = offset[i] + tree_size[subroot[i-1]];
    }
    //assert(offset[num_subtree]==d+num_subtree-1-tree_size[subroot[num_subtree-1]]);

    for (i=0; i<=num_subtree; i++)
      idx[i] = 0;

    for (i=0; i<d; i++) {
      tid = tree_id[si[i]];
      j = idx[tid]++;
      x[offset[tid]+j] = xs[i];
      xmap[i] = j;

      if (isSuperRoot[si[i]]) {
	for (k=1; k<num_subtree; k++) {
	  if (suproot[k]==si[i]) {
	    tid = k+1;
	    j = idx[tid]++;
	    x[offset[tid]+j] = xs[i];
	    xmap[d-1+tid] = j;
	  }
	}
      }
    }

    for (i=0; i<=num_subtree; i++)
      idx[i] = 0;

    for (i=0; i<d; i++) {
      tid = tree_id[i];
      j = idx[tid]++;
      y[offset[tid]+j] = ys[i];
      new_s[offset[tid]+j] = xmap[s[i]];
      order[tid-1][j] = i;

      if (isSuperRoot[i]) {
	for (k=1; k<num_subtree; k++) {
	  if (suproot[k]==i) {
	    tid = k+1;
	    j = idx[tid]++;
	    y[offset[tid]+j] = ys[i];
	    new_s[offset[tid]+j] = xmap[d-1+tid];
	    order[tid-1][j] = i;
	  }
	}
      }
    }

    subtree = (Tree*)malloc(num_subtree*sizeof(Tree));
    for (i=1; i<=num_subtree; i++) {
      if (tree_size[subroot[i-1]] <= 1) {
	subtree[i-1].deg = 0;
	continue;
      }

      t = flutes_c(tree_size[subroot[i-1]], x+offset[i], y+offset[i],
		   new_s+offset[i], acc);
    
      subtree[i-1] = t;
    }


    for (i=1; i<num_subtree; i++) {
      //assert(tree_id[suproot[i]] != tree_id[subroot[i]]);

      t = wmergetree(subtree[tree_id[suproot[i]]-1],
		     subtree[tree_id[subroot[i]]-1],
		     order[tree_id[suproot[i]]-1],
		     order[tree_id[subroot[i]]-1],
		     xs[s[suproot[i]]], ys[suproot[i]], acc);

      subtree[tree_id[subroot[i]]-1].deg = 0;
      subtree[tree_id[suproot[i]]-1] = t;
    }

    t = subtree[0];
    free(subtree);
  
    if (best_t.length < t.length) {
      if (*best_round-rounds >= EARLY_QUIT_CRITERIA) {
	if (t.branch) {
	  free(t.branch);
	}
	break;
      }
    } else if (best_t.length == t.length) {
      *best_round = rounds;
    } else if (best_t.length > t.length) {
      if (best_t.branch) {
	free(best_t.branch);
      }
      best_t = t;
      *best_round = rounds;
    }

    if (rounds > 0) {
      for (i=0; i<d; i++) {
	x[i] = xs[s[i]];
	y[i] = ys[i];
      }

      *min_node1 = edges[0];
      *min_node2 = edges[1];

      update_dist2(t, dist, longest, edges, min_node1, min_node2, nb);
    }

    if (t.branch != 0 && best_t.branch != t.branch) {
      free(t.branch);
    }

    rounds--;
  }
  
#if !(MR_FOR_SMALL_CASES_ONLY)
  free(subroot); free(suproot); free(idx); free(offset); free(order);
  free(isSuperRoot); free(tree_id); free(tree_size); free(edges);
  free(order_base); free(new_s); free(si); free(xmap); free(x); free(y);
#endif
  
#if USE_HASHING
  if (new_ht) {
    for (i=0; i<=d; i++) {
      dl_forall(Tree, ht[i], ttmp) {
	free(ttmp.branch);
      } dl_endfor;
      dl_free(ht[i]);
    }
  }
#endif
  
  return best_t;
}